

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Vgm_Emu::start_track_(Vgm_Emu *this,int track)

{
  byte *pbVar1;
  byte *pbVar2;
  blargg_err_t pcVar3;
  
  pcVar3 = Classic_Emu::start_track_((Classic_Emu *)this,track);
  if (pcVar3 == (blargg_err_t)0x0) {
    pbVar1 = (this->super_Vgm_Emu_Impl).data;
    Sms_Apu::reset(&(this->super_Vgm_Emu_Impl).psg,(uint)*(ushort *)(pbVar1 + 0x28),
                   (uint)pbVar1[0x2a]);
    pbVar2 = (this->super_Vgm_Emu_Impl).data;
    pbVar1 = pbVar2 + 0x40;
    (this->super_Vgm_Emu_Impl).pos = pbVar1;
    (this->super_Vgm_Emu_Impl).pcm_data = pbVar1;
    (this->super_Vgm_Emu_Impl).pcm_pos = pbVar1;
    (this->super_Vgm_Emu_Impl).dac_amp = -1;
    (this->super_Vgm_Emu_Impl).dac_disabled = -1;
    (this->super_Vgm_Emu_Impl).vgm_time = 0;
    if ((0x14f < *(uint *)(pbVar2 + 8)) && (*(uint *)(pbVar2 + 0x34) != 0)) {
      (this->super_Vgm_Emu_Impl).pos = pbVar1 + ((ulong)*(uint *)(pbVar2 + 0x34) - 0xc);
    }
    if (this->uses_fm == true) {
      if ((this->super_Vgm_Emu_Impl).ym2413.last_time != -1) {
        Ym2413_Emu::reset(&(this->super_Vgm_Emu_Impl).ym2413.super_Ym2413_Emu);
      }
      if ((this->super_Vgm_Emu_Impl).ym2612.last_time != -1) {
        Ym2612_Emu::reset(&(this->super_Vgm_Emu_Impl).ym2612.super_Ym2612_Emu);
      }
      (this->super_Vgm_Emu_Impl).fm_time_offset = 0;
      Blip_Buffer::clear(&(this->super_Vgm_Emu_Impl).blip_buf,1);
      (this->super_Vgm_Emu_Impl).super_Dual_Resampler.buf_pos =
           (this->super_Vgm_Emu_Impl).super_Dual_Resampler.sample_buf_size;
      Fir_Resampler_::clear
                (&(this->super_Vgm_Emu_Impl).super_Dual_Resampler.resampler.super_Fir_Resampler_);
    }
    pcVar3 = (blargg_err_t)0x0;
  }
  return pcVar3;
}

Assistant:

blargg_err_t Vgm_Emu::start_track_( int track )
{
	RETURN_ERR( Classic_Emu::start_track_( track ) );
	psg.reset( get_le16( header().noise_feedback ), header().noise_width );
	
	dac_disabled = -1;
	pos          = data + header_size;
	pcm_data     = pos;
	pcm_pos      = pos;
	dac_amp      = -1;
	vgm_time     = 0;
	if ( get_le32( header().version ) >= 0x150 )
	{
		long data_offset = get_le32( header().data_offset );
		check( data_offset );
		if ( data_offset )
			pos += data_offset + offsetof (header_t,data_offset) - 0x40;
	}
	
	if ( uses_fm )
	{
		if ( ym2413.enabled() )
			ym2413.reset();
		
		if ( ym2612.enabled() )
			ym2612.reset();
		
		fm_time_offset = 0;
		blip_buf.clear();
		Dual_Resampler::clear();
	}
	return 0;
}